

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexMathFpu.cpp
# Opt level: O0

void catchSigFpe(int sig,siginfo_t *info,ucontext_t *ucon)

{
  long in_RSI;
  int in_EDI;
  bool in_stack_ffffffffffffffdf;
  ucontext_t *in_stack_ffffffffffffffe0;
  
  Iex_3_2::FpuControl::restoreControlRegs(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf);
  if (Iex_3_2::(anonymous_namespace)::fpeHandler == (code *)0x0) {
    return;
  }
  if (*(int *)(in_RSI + 8) == 0) {
    (*Iex_3_2::(anonymous_namespace)::fpeHandler)
              (0,"Floating-point exception, caused by a signal sent from another process.");
    return;
  }
  if (in_EDI != 8) goto switchD_0017006d_default;
  switch(*(undefined4 *)(in_RSI + 8)) {
  case 1:
    (*Iex_3_2::(anonymous_namespace)::fpeHandler)(0,"Integer division by zero.");
  default:
switchD_0017006d_default:
    (*Iex_3_2::(anonymous_namespace)::fpeHandler)(0,"Floating-point exception.");
    break;
  case 2:
    (*Iex_3_2::(anonymous_namespace)::fpeHandler)(0,"Integer overflow.");
    goto switchD_0017006d_default;
  case 3:
    (*Iex_3_2::(anonymous_namespace)::fpeHandler)(4,"Floating-point division by zero.");
    break;
  case 4:
    (*Iex_3_2::(anonymous_namespace)::fpeHandler)(1,"Floating-point overflow.");
    break;
  case 5:
    (*Iex_3_2::(anonymous_namespace)::fpeHandler)(2,"Floating-point underflow.");
    break;
  case 6:
    (*Iex_3_2::(anonymous_namespace)::fpeHandler)(8,"Inexact floating-point result.");
    break;
  case 7:
    (*Iex_3_2::(anonymous_namespace)::fpeHandler)(0x10,"Invalid floating-point operation.");
    break;
  case 8:
    (*Iex_3_2::(anonymous_namespace)::fpeHandler)(0,"Subscript out of range.");
    goto switchD_0017006d_default;
  }
  return;
}

Assistant:

void
catchSigFpe (int sig, siginfo_t* info, ucontext_t* ucon)
{
    debug ("catchSigFpe (sig = " << sig << ", ...)\n");

    FpuControl::restoreControlRegs (*ucon, true);

    if (fpeHandler == 0) return;

    if (info->si_code == SI_USER)
    {
        fpeHandler (
            0,
            "Floating-point exception, caused by "
            "a signal sent from another process.");
        return;
    }

    if (sig == SIGFPE)
    {
        switch (info->si_code)
        {
                //
                // IEEE 754 floating point exceptions:
                //

            case FPE_FLTDIV:
                fpeHandler (IEEE_DIVZERO, "Floating-point division by zero.");
                return;

            case FPE_FLTOVF:
                fpeHandler (IEEE_OVERFLOW, "Floating-point overflow.");
                return;

            case FPE_FLTUND:
                fpeHandler (IEEE_UNDERFLOW, "Floating-point underflow.");
                return;

            case FPE_FLTRES:
                fpeHandler (IEEE_INEXACT, "Inexact floating-point result.");
                return;

            case FPE_FLTINV:
                fpeHandler (IEEE_INVALID, "Invalid floating-point operation.");
                return;

                //
                // Other arithmetic exceptions which can also
                // be trapped by the operating system:
                //

            case FPE_INTDIV: fpeHandler (0, "Integer division by zero."); break;

            case FPE_INTOVF: fpeHandler (0, "Integer overflow."); break;

            case FPE_FLTSUB: fpeHandler (0, "Subscript out of range."); break;
        }
    }

    fpeHandler (0, "Floating-point exception.");
}